

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O0

ChLoad<MyLoaderPointStiff> * __thiscall
chrono::ChLoad<MyLoaderPointStiff>::Clone(ChLoad<MyLoaderPointStiff> *this)

{
  ChLoad<MyLoaderPointStiff> *this_00;
  ChLoad<MyLoaderPointStiff> *this_local;
  
  this_00 = (ChLoad<MyLoaderPointStiff> *)operator_new(0x80);
  ChLoad(this_00,this);
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }